

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_win_unpart(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t i0;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int64_t i1;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type == GGML_TYPE_F32) {
    lVar2 = pgVar1->ne[0];
    uVar3 = dst->ne[1];
    lVar9 = (long)dst->op_params[0];
    lVar4 = pgVar1->ne[1];
    lVar5 = pgVar1->ne[2];
    uVar6 = dst->ne[0];
    uVar7 = dst->ne[2];
    lVar13 = 0;
    for (uVar10 = 0; uVar10 != (~((long)uVar7 >> 0x3f) & uVar7); uVar10 = uVar10 + 1) {
      lVar12 = lVar13;
      for (uVar11 = 0; uVar11 != (~((long)uVar3 >> 0x3f) & uVar3); uVar11 = uVar11 + 1) {
        for (uVar8 = 0; (~((long)uVar6 >> 0x3f) & uVar6) != uVar8; uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)dst->data + uVar8 * 4 + lVar12) =
               *(undefined4 *)
                ((long)pgVar1->data +
                uVar8 * 4 +
                ((((int)((long)uVar11 / lVar9) +
                  (int)((long)uVar10 / lVar9) *
                  (int)((long)((lVar9 - (long)uVar3 % lVar9) % lVar9 + uVar3) / lVar9)) * lVar5 +
                 (long)uVar10 % lVar9) * lVar4 + (long)uVar11 % lVar9) * lVar2 * 4);
        }
        lVar12 = lVar12 + uVar6 * 4;
      }
      lVar13 = lVar13 + uVar3 * uVar6 * 4;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,0x1e23,"fatal error");
}

Assistant:

void ggml_compute_forward_win_unpart(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_win_unpart_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}